

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O0

longlong __thiscall mkvparser::SegmentInfo::GetDuration(SegmentInfo *this)

{
  longlong d;
  double dd;
  SegmentInfo *this_local;
  long local_8;
  
  if (0.0 < this->m_duration || this->m_duration == 0.0) {
    local_8 = (long)(this->m_duration * (double)this->m_timecodeScale);
  }
  else {
    local_8 = -1;
  }
  return local_8;
}

Assistant:

long long SegmentInfo::GetDuration() const {
  if (m_duration < 0)
    return -1;

  assert(m_timecodeScale >= 1);

  const double dd = double(m_duration) * double(m_timecodeScale);
  const long long d = static_cast<long long>(dd);

  return d;
}